

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transition.cc
# Opt level: O0

void __thiscall
tchecker::syncprod::transition_t::transition_t
          (transition_t *this,transition_t *t,sync_id_t sync_id,
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
          *vedge)

{
  vedge_t *vedge_00;
  make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *pmVar1;
  bool local_35;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
  *vedge_local;
  sync_id_t sync_id_local;
  transition_t *t_local;
  transition_t *this_local;
  
  this->_sync_id = sync_id;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::
  intrusive_shared_ptr_t(&this->_vedge,vedge);
  local_35 = true;
  if (this->_sync_id == 0xffffffff) {
    vedge_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
                ::operator*(&this->_vedge)->super_vedge_t;
    local_35 = is_asynchronous(vedge_00);
  }
  if (local_35 == false) {
    __assert_fail("(_sync_id != tchecker::NO_SYNC) || tchecker::is_asynchronous(*_vedge)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/syncprod/transition.cc"
                  ,0x24,
                  "tchecker::syncprod::transition_t::transition_t(const tchecker::syncprod::transition_t &, tchecker::sync_id_t, const tchecker::intrusive_shared_ptr_t<tchecker::shared_vedge_t> &)"
                 );
  }
  pmVar1 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::
           ptr(&this->_vedge);
  if (pmVar1 != (make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *)0x0) {
    return;
  }
  __assert_fail("_vedge.ptr() != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/syncprod/transition.cc"
                ,0x25,
                "tchecker::syncprod::transition_t::transition_t(const tchecker::syncprod::transition_t &, tchecker::sync_id_t, const tchecker::intrusive_shared_ptr_t<tchecker::shared_vedge_t> &)"
               );
}

Assistant:

transition_t::transition_t(tchecker::syncprod::transition_t const & t, tchecker::sync_id_t sync_id,
                           tchecker::intrusive_shared_ptr_t<tchecker::shared_vedge_t> const & vedge)
    : tchecker::ts::transition_t(t), _sync_id(sync_id), _vedge(vedge)
{
  assert((_sync_id != tchecker::NO_SYNC) || tchecker::is_asynchronous(*_vedge));
  assert(_vedge.ptr() != nullptr);
}